

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O1

vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> * __thiscall
helics::BaseTimeCoordinator::getDependents
          (vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
           *__return_storage_ptr__,BaseTimeCoordinator *this)

{
  pointer pDVar1;
  iterator __position;
  GlobalFederateId *__args;
  pointer pDVar2;
  
  (__return_storage_ptr__->
  super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar2 = (this->dependencies).dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (this->dependencies).dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pDVar2 != pDVar1) {
    __args = &pDVar2->fedID;
    do {
      if (*(bool *)((long)(__args + 1) + 2) == true) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>::
          _M_realloc_insert<helics::GlobalFederateId_const&>
                    ((vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>> *)
                     __return_storage_ptr__,__position,__args);
        }
        else {
          (__position._M_current)->gid = __args->gid;
          (__return_storage_ptr__->
          super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>).
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      pDVar2 = (pointer)(__args + 4);
      __args = __args + 0x16;
    } while (pDVar2 != pDVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<GlobalFederateId> BaseTimeCoordinator::getDependents() const
{
    std::vector<GlobalFederateId> deps;
    for (const auto& dep : dependencies) {
        if (dep.dependent) {
            deps.push_back(dep.fedID);
        }
    }
    return deps;
}